

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O3

bool __thiscall
LoopCrosser::HasCrossing(LoopCrosser *this,RangeIterator_conflict *ai,RangeIterator_conflict *bi)

{
  pointer *pppSVar1;
  pointer ppSVar2;
  iterator __position;
  ulong uVar3;
  pointer ppSVar4;
  compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *this_00;
  bool bVar5;
  const_reference pvVar6;
  const_reference b_clipped;
  int iVar7;
  pointer ppSVar8;
  S2LogMessage local_48;
  S2CellId local_38;
  
  local_38.id_ = (ai->it_).super_IteratorBase.id_.id_;
  bVar5 = S2CellId::contains(&local_38,(S2CellId)(bi->it_).super_IteratorBase.id_.id_);
  if (!bVar5) {
    S2LogMessage::S2LogMessage
              (&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2loop.cc"
               ,0x38e,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_48.stream_,"Check failed: ai->id().contains(bi->id()) ",0x2a);
    abort();
  }
  ppSVar2 = (this->b_cells_).
            super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->b_cells_).
      super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppSVar2) {
    (this->b_cells_).
    super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppSVar2;
  }
  iVar7 = 0;
  do {
    pvVar6 = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::operator[]
                       ((compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *)
                        (bi->it_).super_IteratorBase.cell_._M_b._M_p,0);
    if (1 < *(uint *)&pvVar6->field_0x4) {
      pvVar6 = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::operator[]
                         ((compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *)
                          (bi->it_).super_IteratorBase.cell_._M_b._M_p,0);
      iVar7 = (*(uint *)&pvVar6->field_0x4 >> 1) + iVar7;
      if (0x13 < iVar7) {
        pvVar6 = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::
                 operator[]((compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *)
                            (ai->it_).super_IteratorBase.cell_._M_b._M_p,0);
        bVar5 = CellCrossesAnySubcell(this,pvVar6,(S2CellId)(ai->it_).super_IteratorBase.id_.id_);
        if (bVar5) {
          return true;
        }
        RangeIterator::SeekBeyond((RangeIterator *)bi,ai);
        goto LAB_001fc7ff;
      }
      local_48._0_8_ = (bi->it_).super_IteratorBase.cell_._M_b._M_p;
      __position._M_current =
           (this->b_cells_).
           super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->b_cells_).
          super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<S2ShapeIndexCell_const*,std::allocator<S2ShapeIndexCell_const*>>::
        _M_realloc_insert<S2ShapeIndexCell_const*>
                  ((vector<S2ShapeIndexCell_const*,std::allocator<S2ShapeIndexCell_const*>> *)
                   &this->b_cells_,__position,(S2ShapeIndexCell **)&local_48);
      }
      else {
        *__position._M_current = (S2ShapeIndexCell *)local_48._0_8_;
        pppSVar1 = &(this->b_cells_).
                    super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppSVar1 = *pppSVar1 + 1;
      }
    }
    MutableS2ShapeIndex::Iterator::Next(&bi->it_);
    uVar3 = (bi->it_).super_IteratorBase.id_.id_;
    (bi->range_min_).id_ = uVar3 - (~uVar3 & uVar3 - 1);
    (bi->range_max_).id_ = uVar3 - 1 | uVar3;
  } while (uVar3 <= (ai->range_max_).id_);
  ppSVar2 = (this->b_cells_).
            super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppSVar4 = (this->b_cells_).
            super__Vector_base<const_S2ShapeIndexCell_*,_std::allocator<const_S2ShapeIndexCell_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppSVar2 == ppSVar4) {
LAB_001fc7ff:
    bVar5 = false;
  }
  else {
    do {
      ppSVar8 = ppSVar2 + 1;
      this_00 = (compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *)*ppSVar2;
      pvVar6 = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::operator[]
                         ((compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *)
                          (ai->it_).super_IteratorBase.cell_._M_b._M_p,0);
      b_clipped = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::
                  operator[](this_00,0);
      bVar5 = CellCrossesCell(this,pvVar6,b_clipped);
      if (bVar5) {
        return bVar5;
      }
      ppSVar2 = ppSVar8;
    } while (ppSVar8 != ppSVar4);
  }
  return bVar5;
}

Assistant:

bool LoopCrosser::HasCrossing(RangeIterator* ai, RangeIterator* bi) {
  S2_DCHECK(ai->id().contains(bi->id()));
  // If ai->id() intersects many edges of B, then it is faster to use
  // S2CrossingEdgeQuery to narrow down the candidates.  But if it intersects
  // only a few edges, it is faster to check all the crossings directly.
  // We handle this by advancing "bi" and keeping track of how many edges we
  // would need to test.

  static const int kEdgeQueryMinEdges = 20;  // Tuned using benchmarks.
  int total_edges = 0;
  b_cells_.clear();
  do {
    if (bi->num_edges() > 0) {
      total_edges += bi->num_edges();
      if (total_edges >= kEdgeQueryMinEdges) {
        // There are too many edges to test them directly, so use
        // S2CrossingEdgeQuery.
        if (CellCrossesAnySubcell(ai->clipped(), ai->id())) return true;
        bi->SeekBeyond(*ai);
        return false;
      }
      b_cells_.push_back(&bi->cell());
    }
    bi->Next();
  } while (bi->id() <= ai->range_max());

  // Test all the edge crossings directly.
  for (const S2ShapeIndexCell* b_cell : b_cells_) {
    if (CellCrossesCell(ai->clipped(), b_cell->clipped(0))) {
      return true;
    }
  }
  return false;
}